

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool runCommand(Options *options,QString *command)

{
  bool bVar1;
  char *pcVar2;
  FILE *pFVar3;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  UP runCommand;
  char buffer [4096];
  pointer in_stack_ffffffffffffef78;
  undefined7 in_stack_ffffffffffffef80;
  undefined1 in_stack_ffffffffffffef87;
  FILE *in_stack_ffffffffffffef98;
  bool local_1041;
  char local_1008 [4096];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    in_stack_ffffffffffffef98 = _stdout;
    QtPrivate::asString(in_RSI);
    QString::toLocal8Bit((QString *)in_stack_ffffffffffffef98);
    pcVar2 = QByteArray::constData((QByteArray *)0x124261);
    fprintf(in_stack_ffffffffffffef98,"Running command \'%s\'\n",pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x124281);
  }
  openProcess((QString *)in_stack_ffffffffffffef98);
  bVar1 = std::operator==((unique_ptr<_IO_FILE,_Closer> *)
                          CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
                          in_stack_ffffffffffffef78);
  pFVar3 = _stderr;
  if (bVar1) {
    QtPrivate::asString(in_RSI);
    QString::toLocal8Bit((QString *)in_stack_ffffffffffffef98);
    pcVar2 = QByteArray::constData((QByteArray *)0x1242e0);
    fprintf(pFVar3,"Cannot run command \'%s\'\n",pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x124300);
    local_1041 = false;
  }
  else {
    memset(local_1008,0xaa,0x1000);
    while( true ) {
      pFVar3 = (FILE *)std::unique_ptr<_IO_FILE,_Closer>::get
                                 ((unique_ptr<_IO_FILE,_Closer> *)0x124340);
      pcVar2 = fgets(local_1008,0x1000,pFVar3);
      if (pcVar2 == (char *)0x0) break;
      if ((*(byte *)(in_RDI + 1) & 1) != 0) {
        fprintf(_stdout,"%s",local_1008);
      }
    }
    std::unique_ptr<_IO_FILE,_Closer>::reset
              ((unique_ptr<_IO_FILE,_Closer> *)
               CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               in_stack_ffffffffffffef78);
    fflush(_stdout);
    fflush(_stderr);
    local_1041 = true;
  }
  std::unique_ptr<_IO_FILE,_Closer>::~unique_ptr
            ((unique_ptr<_IO_FILE,_Closer> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1041;
}

Assistant:

bool runCommand(const Options &options, const QString &command)
{
    if (options.verbose)
        fprintf(stdout, "Running command '%s'\n", qPrintable(command));

    auto runCommand = openProcess(command);
    if (runCommand == nullptr) {
        fprintf(stderr, "Cannot run command '%s'\n", qPrintable(command));
        return false;
    }
    char buffer[4096];
    while (fgets(buffer, sizeof(buffer), runCommand.get()) != nullptr) {
        if (options.verbose)
            fprintf(stdout, "%s", buffer);
    }
    runCommand.reset();
    fflush(stdout);
    fflush(stderr);
    return true;
}